

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<lightlist_t,_lightlist_t>::Push(TArray<lightlist_t,_lightlist_t> *this,lightlist_t *item)

{
  double *pdVar1;
  uint uVar2;
  lightlist_t *plVar3;
  double dVar4;
  FDynamicColormap *pFVar5;
  F3DFloor *pFVar6;
  lightlist_t *plVar7;
  PalEntry PVar8;
  int iVar9;
  
  Grow(this,1);
  plVar3 = this->Array;
  uVar2 = this->Count;
  dVar4 = (item->plane).normal.Y;
  plVar3[uVar2].plane.normal.X = (item->plane).normal.X;
  plVar3[uVar2].plane.normal.Y = dVar4;
  plVar3[uVar2].plane.normal.Z = (item->plane).normal.Z;
  dVar4 = (item->plane).negiC;
  pdVar1 = &plVar3[uVar2].plane.D;
  *pdVar1 = (item->plane).D;
  pdVar1[1] = dVar4;
  pFVar5 = item->extra_colormap;
  PVar8.field_0 = (item->blend).field_0;
  iVar9 = item->flags;
  pFVar6 = item->lightsource;
  plVar3[uVar2].p_lightlevel = item->p_lightlevel;
  (&plVar3[uVar2].p_lightlevel)[1] = (short *)pFVar5;
  plVar7 = plVar3 + uVar2;
  plVar7->blend = (PalEntry)PVar8.field_0;
  plVar7->flags = iVar9;
  *(F3DFloor **)(&plVar7->blend + 2) = pFVar6;
  plVar3[uVar2].caster = item->caster;
  uVar2 = this->Count;
  this->Count = uVar2 + 1;
  return uVar2;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}